

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

void __thiscall
crnlib::
hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
::reserve(hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
          *this,uint new_capacity)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  undefined4 local_18;
  uint new_hash_size;
  uint new_capacity_local;
  hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
  *this_local;
  
  uVar2 = math::maximum<unsigned_int>(1,new_capacity);
  local_18 = uVar2 << 1;
  bVar1 = math::is_power_of_2(local_18);
  if (!bVar1) {
    local_18 = math::next_pow2(local_18);
  }
  uVar2 = math::maximum<unsigned_int>(4,local_18);
  uVar3 = vector<crnlib::hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>::raw_node>
          ::size(&this->m_values);
  if (uVar3 < uVar2) {
    rehash(this,uVar2);
  }
  return;
}

Assistant:

inline void reserve(uint new_capacity)
        {
            uint new_hash_size = math::maximum(1U, new_capacity);

            new_hash_size = new_hash_size * 2U;

            if (!math::is_power_of_2(new_hash_size))
            {
                new_hash_size = math::next_pow2(new_hash_size);
            }

            new_hash_size = math::maximum<uint>(cMinHashSize, new_hash_size);

            if (new_hash_size > m_values.size())
            {
                rehash(new_hash_size);
            }
        }